

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O0

void Gia_ManPrepareWin(Gia_Man_t *p,Vec_Int_t *vOuts,Vec_Int_t **pvPis,Vec_Int_t **pvPos,
                      Vec_Int_t **pvAnds,int fPoOnly)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  int local_44;
  Gia_Obj_t *pGStack_40;
  int i;
  Gia_Obj_t *pObj;
  int fPoOnly_local;
  Vec_Int_t **pvAnds_local;
  Vec_Int_t **pvPos_local;
  Vec_Int_t **pvPis_local;
  Vec_Int_t *vOuts_local;
  Gia_Man_t *p_local;
  
  Gia_ManIncrementTravId(p);
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vOuts);
    bVar4 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vOuts,local_44);
      pGStack_40 = Gia_ManCo(p,iVar1);
      bVar4 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjFaninId0p(p,pGStack_40);
    Gia_ManHighlight_rec(p,iVar1);
    local_44 = local_44 + 1;
  }
  Gia_ManCleanMark0(p);
  if (fPoOnly == 0) {
    local_44 = 1;
    while( true ) {
      bVar4 = false;
      if (local_44 < p->nObjs) {
        pGStack_40 = Gia_ManObj(p,local_44);
        bVar4 = pGStack_40 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjIsCi(pGStack_40);
      if ((iVar1 == 0) &&
         ((iVar1 = Gia_ObjIsAnd(pGStack_40), iVar1 == 0 ||
          (iVar1 = Gia_ObjIsTravIdCurrentId(p,local_44), iVar1 != 0)))) {
        pGVar2 = Gia_ObjFanin0(pGStack_40);
        *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
        iVar1 = Gia_ObjIsAnd(pGStack_40);
        if (iVar1 != 0) {
          pGVar2 = Gia_ObjFanin1(pGStack_40);
          *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
        }
      }
      local_44 = local_44 + 1;
    }
  }
  else {
    local_44 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vOuts);
      bVar4 = false;
      if (local_44 < iVar1) {
        iVar1 = Vec_IntEntry(vOuts,local_44);
        pGStack_40 = Gia_ManCo(p,iVar1);
        bVar4 = pGStack_40 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pGVar2 = Gia_ObjFanin0(pGStack_40);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      local_44 = local_44 + 1;
    }
  }
  pVVar3 = Vec_IntAlloc(1000);
  *pvPis = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  *pvPos = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  *pvAnds = pVVar3;
  local_44 = 1;
  while( true ) {
    bVar4 = false;
    if (local_44 < p->nObjs) {
      pGStack_40 = Gia_ManObj(p,local_44);
      bVar4 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsTravIdCurrentId(p,local_44);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsCi(pGStack_40);
      if (iVar1 == 0) {
        if ((*(ulong *)pGStack_40 >> 0x1e & 1) != 0) {
          Vec_IntPush(*pvPos,local_44);
        }
      }
      else {
        Vec_IntPush(*pvPis,local_44);
      }
      iVar1 = Gia_ObjIsAnd(pGStack_40);
      if (iVar1 != 0) {
        Vec_IntPush(*pvAnds,local_44);
      }
    }
    local_44 = local_44 + 1;
  }
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManPrepareWin( Gia_Man_t * p, Vec_Int_t * vOuts, Vec_Int_t ** pvPis, Vec_Int_t ** pvPos, Vec_Int_t ** pvAnds, int fPoOnly )
{
    Gia_Obj_t * pObj;
    int i;
    // mark the section
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoVec( vOuts, p, pObj, i )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId0p(p, pObj) );
    // mark fanins of the outside area
    Gia_ManCleanMark0( p );
    if ( fPoOnly )
    {
        Gia_ManForEachCoVec( vOuts, p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsCi(pObj) )
                continue;
            if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId(p, i) )
                continue;
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            if ( Gia_ObjIsAnd(pObj) )
                Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
    }
    // collect pointed nodes
    *pvPis  = Vec_IntAlloc( 1000 );
    *pvPos  = Vec_IntAlloc( 1000 );
    *pvAnds = Vec_IntAlloc( 1000 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrentId(p, i) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            Vec_IntPush( *pvPis, i );
        else if ( pObj->fMark0 )
            Vec_IntPush( *pvPos, i );
        if ( Gia_ObjIsAnd(pObj) )
            Vec_IntPush( *pvAnds, i );
    }
    Gia_ManCleanMark0( p );
}